

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PlatformInterface *pPVar3;
  bool bVar4;
  int iVar5;
  VkAllocationCallbacks *pVVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  Environment rootEnv;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  AllocationCallbackRecorder resCallbacks;
  deUint32 local_a40 [2];
  BinaryCollection *local_a38;
  VkAllocationCallbacks *local_a30;
  deUint32 local_a28;
  Environment local_a18;
  VkBufferCreateInfo local_9e0;
  Move<vk::Handle<(vk::HandleType)8>_> local_9a8;
  undefined1 local_988 [8];
  Deleter<vk::Handle<(vk::HandleType)8>_> aDStack_980 [4];
  ios_base local_910 [272];
  DeterministicFailAllocator local_800;
  AllocationCallbackRecorder local_7b0;
  AllocationCallbackRecorder local_750;
  EnvClone local_6f0;
  
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_750,pVVar6,0x80);
  pPVar3 = *(PlatformInterface **)(this + 8);
  pDVar7 = Context::getDeviceInterface((Context *)this);
  pVVar8 = Context::getDevice((Context *)this);
  local_a18.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_a18.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_a18.allocationCallbacks =
       &local_750.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_a18.maxResourceConsumers = 1;
  local_a18.vkp = pPVar3;
  local_a18.vkd = pDVar7;
  local_a18.device = pVVar8;
  tcu::CommandLine::getTestIterationCount(*(CommandLine **)(*(long *)this + 0x18));
  iVar5 = tcu::CommandLine::getVKDeviceId(*(CommandLine **)(*(long *)this + 0x18));
  local_988 = (undefined1  [8])((ulong)(iVar5 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_6f0,&local_a18,(Parameters *)local_988,iVar5 - 1U);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar2 = &(__return_storage_ptr__->m_description).field_2;
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::DeterministicFailAllocator::DeterministicFailAllocator
            (&local_800,pVVar6,MODE_COUNT_AND_FAIL,0);
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            (&local_7b0,&local_800.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
            );
  local_a40[0] = local_6f0.env.queueFamilyIndex;
  local_a38 = local_6f0.env.programBinaries;
  local_a30 = &local_7b0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_a28 = local_6f0.env.maxResourceConsumers;
  local_988 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_980);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aDStack_980,"Trying to create object with ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)aDStack_980);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_980," allocation",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_980,"s",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_980," passing",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_988,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_980);
  std::ios_base::~ios_base(local_910);
  local_9e0.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_9e0.pNext = (void *)0x0;
  local_9e0.flags = 0;
  local_9e0.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_9e0.queueFamilyIndexCount = 1;
  local_9e0.pQueueFamilyIndices = local_a40;
  local_9e0.size = (VkDeviceSize)context;
  local_9e0.usage = (VkBufferUsageFlags)params.size;
  ::vk::createBuffer(&local_9a8,local_6f0.env.vkd,local_6f0.env.device,&local_9e0,local_a30);
  local_988 = (undefined1  [8])
              local_9a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  aDStack_980[0].m_deviceIface =
       local_9a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  aDStack_980[0].m_device =
       local_9a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  aDStack_980[0].m_allocator =
       local_9a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  if (local_9a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (aDStack_980,
               (VkBuffer)
               local_9a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  bVar4 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&local_7b0,0);
  if (bVar4) {
    local_988 = *(undefined1 (*) [8])(*(long *)this + 0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_980);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_980,"Object construction succeeded! ",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_988,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_980);
    std::ios_base::~ios_base(local_910);
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7b0);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_800.super_ChainedAllocator);
    bVar4 = true;
  }
  else {
    local_988 = (undefined1  [8])&aDStack_980[0].m_device;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_988,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar1,local_988,
               (undefined1 *)
               ((long)local_988 + (long)&(aDStack_980[0].m_deviceIface)->_vptr_DeviceInterface));
    if (local_988 != (undefined1  [8])&aDStack_980[0].m_device) {
      operator_delete((void *)local_988,(ulong)(aDStack_980[0].m_device + 1));
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7b0);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_800.super_ChainedAllocator);
    bVar4 = false;
  }
  ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
  if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
  if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  if (bVar4) {
    bVar4 = ::vk::validateAndLog(*(TestLog **)(*(long *)this + 0x10),&local_750,0);
    if (bVar4) {
      local_6f0.deviceRes.instance._0_8_ =
           &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6f0,"Allocation callbacks not called","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                 local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object
                 + local_6f0.deviceRes.instance._0_8_);
    }
    else {
      local_6f0.deviceRes.instance._0_8_ =
           &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6f0,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                 local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object
                 + local_6f0.deviceRes.instance._0_8_);
    }
    if ((Deleter<vk::VkInstance_s_*> *)local_6f0.deviceRes.instance._0_8_ !=
        &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter) {
      operator_delete((void *)local_6f0.deviceRes.instance._0_8_,
                      (ulong)(local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                              m_data.deleter.m_destroyInstance + 1));
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_750);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}